

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

bool __thiscall CSocekt::Initialize_subproc(CSocekt *this)

{
  vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *this_00;
  int iVar1;
  SourceFile file;
  SourceFile file_00;
  ThreadItem *pTimemonitor;
  ThreadItem *pRecyconn;
  ThreadItem *pSendQueue;
  undefined1 local_1010 [12];
  undefined1 local_1000 [12];
  Logger local_ff0;
  
  iVar1 = sem_init((sem_t *)&this->m_semEventSendQueue,0,0);
  if (iVar1 == -1) {
    if (2 < muduo::g_logLevel) {
      return false;
    }
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1000,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file_00._12_4_ = 0;
    file_00.data_ = (char *)local_1000._0_8_;
    file_00.size_ = local_1000._8_4_;
    muduo::Logger::Logger(&local_ff0,file_00,0x6a);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_18721);
  }
  else {
    this_00 = &this->m_threadVector;
    pSendQueue = (ThreadItem *)operator_new(0x18);
    pSendQueue->_pThis = this;
    pSendQueue->ifrunning = false;
    std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::push_back
              (this_00,&pSendQueue);
    iVar1 = pthread_create(&pSendQueue->_Handle,(pthread_attr_t *)0x0,ServerSendQueueThread,
                           pSendQueue);
    if (iVar1 != 0) {
      return false;
    }
    pRecyconn = (ThreadItem *)operator_new(0x18);
    pRecyconn->_pThis = this;
    pRecyconn->ifrunning = false;
    std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::push_back
              (this_00,&pRecyconn);
    iVar1 = pthread_create(&pRecyconn->_Handle,(pthread_attr_t *)0x0,ServerRecyConnectionThread,
                           pRecyconn);
    if (iVar1 != 0) {
      return false;
    }
    if (this->m_ifkickTimeCount != 1) {
      return true;
    }
    pTimemonitor = (ThreadItem *)operator_new(0x18);
    pTimemonitor->_pThis = this;
    pTimemonitor->ifrunning = false;
    std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::push_back
              (this_00,&pTimemonitor);
    iVar1 = pthread_create(&pTimemonitor->_Handle,(pthread_attr_t *)0x0,
                           ServerTimerQueueMonitorThread,pTimemonitor);
    if (iVar1 == 0) {
      return true;
    }
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1010,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1010._0_8_;
    file.size_ = local_1010._8_4_;
    muduo::Logger::Logger(&local_ff0,file,0x88,ERROR);
    muduo::LogStream::operator<<(&local_ff0.impl_.stream_,anon_var_dwarf_18737);
  }
  muduo::Logger::~Logger(&local_ff0);
  return false;
}

Assistant:

bool CSocekt::Initialize_subproc()
{
     //互斥量的初始化已经写成互斥类MutexLock的构造函数里面了
   
    //初始化发消息相关信号量，信号量用于进程/线程 之间的同步，虽然 互斥量[pthread_mutex_lock]和 条件变量[pthread_cond_wait]都是线程之间的同步手段，但
    //这里用信号量实现 则 更容易理解，更容易简化问题，使用书写的代码短小且清晰；
    //第二个参数=0，表示信号量在线程之间共享，确实如此 ，如果非0，表示在进程之间共享
    //第三个参数=0，表示信号量的初始值，为0时，调用sem_wait()就会卡在那里卡着
    if(sem_init(&m_semEventSendQueue,0,0) == -1)
    {
        //ngx_log_stderr(0,"CSocekt::Initialize()中sem_init(&m_semEventSendQueue,0,0)失败.");
        LOG_INFO << "CSocekt::Initialize()中sem_init(&m_semEventSendQueue,0,0)失败.";
        return false;
    }

    //创建线程
    int err;
    ThreadItem *pSendQueue;    //专门用来发送数据的线程
    m_threadVector.push_back(pSendQueue = new ThreadItem(this));                         //创建 一个新线程对象 并入到容器中 
    err = pthread_create(&pSendQueue->_Handle, NULL, ServerSendQueueThread,pSendQueue); //创建线程，错误不返回到errno，一般返回错误码
    if(err != 0)
    {
        return false;
    }

    //---
    ThreadItem *pRecyconn;    //专门用来回收连接的线程
    m_threadVector.push_back(pRecyconn = new ThreadItem(this)); 
    err = pthread_create(&pRecyconn->_Handle, NULL, ServerRecyConnectionThread,pRecyconn);
    if(err != 0)
    {
        return false;
    }

    if(m_ifkickTimeCount == 1)  //是否开启踢人时钟，1：开启   0：不开启
    {
        ThreadItem *pTimemonitor;    //专门用来处理到期不发心跳包的用户踢出的线程
        m_threadVector.push_back(pTimemonitor = new ThreadItem(this)); 
        err = pthread_create(&pTimemonitor->_Handle, NULL, ServerTimerQueueMonitorThread,pTimemonitor);
        if(err != 0)
        {
            LOG_ERROR << "CSocekt::Initialize_subproc()中pthread_create(ServerTimerQueueMonitorThread)失败.";
            return false;
        }
    }

    return true;
}